

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

void __thiscall
node::BlockManager::UnlinkPrunedFiles
          (BlockManager *this,set<int,_std::less<int>,_std::allocator<int>_> *setFilesToPrune)

{
  string_view source_file;
  char cVar1;
  char cVar2;
  bool bVar3;
  Logger *pLVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  char *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  FlatFilePos pos;
  error_code ec;
  string log_msg;
  FlatFilePos local_100;
  error_code local_f8;
  path local_e0 [3];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8._M_value = 0;
  local_f8._M_cat = (error_category *)std::_V2::system_category();
  p_Var5 = (setFilesToPrune->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(setFilesToPrune->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var6) {
    do {
      local_100.nFile = p_Var5[1]._M_color;
      local_100.nPos = 0;
      FlatFileSeq::FileName((path *)local_e0,&this->m_block_file_seq,&local_100);
      cVar1 = std::filesystem::remove((path *)local_e0,&local_f8);
      std::filesystem::__cxx11::path::~path(local_e0);
      FlatFileSeq::FileName((path *)local_e0,&this->m_undo_file_seq,&local_100);
      cVar2 = std::filesystem::remove((path *)local_e0,&local_f8);
      std::filesystem::__cxx11::path::~path(local_e0);
      if ((cVar1 != '\0') || (cVar2 != '\0')) {
        pLVar4 = LogInstance();
        bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,BLOCKSTORAGE,Debug);
        if (bVar3) {
          pLVar4 = LogInstance();
          bVar3 = BCLog::Logger::Enabled(pLVar4);
          if (bVar3) {
            local_e0[0]._M_pathname._M_dataplus._M_p = (pointer)&local_e0[0]._M_pathname.field_2;
            local_e0[0]._M_pathname._M_string_length = 0;
            local_e0[0]._M_pathname.field_2._M_local_buf[0] = '\0';
            tinyformat::format<char[18],int>
                      (&local_58,(tinyformat *)"Prune: %s deleted blk/rev (%05u)\n",
                       "UnlinkPrunedFiles",(char (*) [18])(p_Var5 + 1),(int *)in_R8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_e0[0]._M_pathname,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            pLVar4 = LogInstance();
            local_58._M_dataplus._M_p = (pointer)0x5e;
            local_58._M_string_length = 0x801f09;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
            ;
            source_file._M_len = 0x5e;
            str._M_str = local_e0[0]._M_pathname._M_dataplus._M_p;
            str._M_len = local_e0[0]._M_pathname._M_string_length;
            logging_function._M_str = "UnlinkPrunedFiles";
            logging_function._M_len = 0x11;
            in_R8 = "UnlinkPrunedFiles";
            BCLog::Logger::LogPrintStr
                      (pLVar4,str,logging_function,source_file,0x32f,BLOCKSTORAGE,Debug);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0[0]._M_pathname._M_dataplus._M_p != &local_e0[0]._M_pathname.field_2) {
              operator_delete(local_e0[0]._M_pathname._M_dataplus._M_p,
                              CONCAT71(local_e0[0]._M_pathname.field_2._M_allocated_capacity._1_7_,
                                       local_e0[0]._M_pathname.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BlockManager::UnlinkPrunedFiles(const std::set<int>& setFilesToPrune) const
{
    std::error_code ec;
    for (std::set<int>::iterator it = setFilesToPrune.begin(); it != setFilesToPrune.end(); ++it) {
        FlatFilePos pos(*it, 0);
        const bool removed_blockfile{fs::remove(m_block_file_seq.FileName(pos), ec)};
        const bool removed_undofile{fs::remove(m_undo_file_seq.FileName(pos), ec)};
        if (removed_blockfile || removed_undofile) {
            LogDebug(BCLog::BLOCKSTORAGE, "Prune: %s deleted blk/rev (%05u)\n", __func__, *it);
        }
    }
}